

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O1

bool __thiscall
MT32Emu::Partial::doProduceOutput<short,MT32Emu::LA32IntPartialPair>
          (Partial *this,short *leftBuf,short *rightBuf,Bit32u length,
          LA32IntPartialPair *la32PairImpl)

{
  bool bVar1;
  bool bVar2;
  Bit16s BVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  bVar1 = canProduceOutput(this);
  if (bVar1) {
    this->alreadyOutputed = true;
    this->sampleNum = 0;
    if (length != 0) {
      lVar7 = 0;
      do {
        bVar2 = generateNextSample<MT32Emu::LA32IntPartialPair>(this,la32PairImpl);
        if (!bVar2) break;
        BVar3 = LA32IntPartialPair::nextOutSample(la32PairImpl);
        iVar6 = (int)*(short *)((long)leftBuf + lVar7) + (this->leftPanValue * (int)BVar3 >> 0xd);
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar4 = ((int)BVar3 * this->rightPanValue >> 0xd) + (int)*(short *)((long)rightBuf + lVar7);
        *(short *)((long)leftBuf + lVar7) = (short)iVar6;
        if (iVar4 < -0x7fff) {
          iVar4 = -0x8000;
        }
        if (0x7ffe < iVar4) {
          iVar4 = 0x7fff;
        }
        *(short *)((long)rightBuf + lVar7) = (short)iVar4;
        uVar5 = this->sampleNum + 1;
        this->sampleNum = uVar5;
        lVar7 = lVar7 + 2;
      } while (uVar5 < length);
    }
    this->sampleNum = 0;
  }
  return bVar1;
}

Assistant:

bool Partial::doProduceOutput(Sample *leftBuf, Sample *rightBuf, Bit32u length, LA32PairImpl *la32PairImpl) {
	if (!canProduceOutput()) return false;
	alreadyOutputed = true;

	for (sampleNum = 0; sampleNum < length; sampleNum++) {
		if (!generateNextSample(la32PairImpl)) break;
		produceAndMixSample(leftBuf, rightBuf, la32PairImpl);
	}
	sampleNum = 0;
	return true;
}